

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O2

char * testing::internal::StringFromGTestEnv(char *flag,char *default_value)

{
  long lVar1;
  char *pcVar2;
  long in_FS_OFFSET;
  string env_var;
  char *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  FlagToEnvVar_abi_cxx11_(in_stack_ffffffffffffffc8);
  pcVar2 = getenv(in_stack_ffffffffffffffc8);
  if (pcVar2 != (char *)0x0) {
    default_value = pcVar2;
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return default_value;
  }
  __stack_chk_fail();
}

Assistant:

const char* StringFromGTestEnv(const char* flag, const char* default_value) {
#if defined(GTEST_GET_STRING_FROM_ENV_)
  return GTEST_GET_STRING_FROM_ENV_(flag, default_value);
#else
  const std::string env_var = FlagToEnvVar(flag);
  const char* const value = posix::GetEnv(env_var.c_str());
  return value == NULL ? default_value : value;
#endif  // defined(GTEST_GET_STRING_FROM_ENV_)
}